

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void * WindowSettingsHandler_ReadOpen
                 (ImGuiContext *param_1,ImGuiSettingsHandler *param_2,char *name)

{
  ImGuiID IVar1;
  ImGuiWindowSettings *pIVar2;
  ImGuiID id;
  ImGuiWindowSettings *settings;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  ImVec2ih in_stack_ffffffffffffffd4;
  undefined2 local_28;
  
  pIVar2 = ImGui::FindOrCreateWindowSettings
                     ((char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  IVar1 = pIVar2->ID;
  ImGuiWindowSettings::ImGuiWindowSettings
            ((ImGuiWindowSettings *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  pIVar2->ID = in_stack_ffffffffffffffcc;
  (pIVar2->Pos).x = (short)in_stack_ffffffffffffffd0;
  (pIVar2->Pos).y = (short)((uint)in_stack_ffffffffffffffd0 >> 0x10);
  pIVar2->Size = in_stack_ffffffffffffffd4;
  pIVar2->Collapsed = (bool)(undefined1)local_28;
  pIVar2->WantApply = (bool)local_28._1_1_;
  pIVar2->ID = IVar1;
  pIVar2->WantApply = true;
  return pIVar2;
}

Assistant:

static void* WindowSettingsHandler_ReadOpen(ImGuiContext*, ImGuiSettingsHandler*, const char* name)
{
    ImGuiWindowSettings* settings = ImGui::FindOrCreateWindowSettings(name);
    ImGuiID id = settings->ID;
    *settings = ImGuiWindowSettings(); // Clear existing if recycling previous entry
    settings->ID = id;
    settings->WantApply = true;
    return (void*)settings;
}